

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (Result<CBlockIndex_*> *__return_storage_ptr__,ChainstateManager *this,
          AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_t sVar3;
  CTxMemPool *this_00;
  string original;
  string original_00;
  string original_01;
  string original_02;
  string original_03;
  string original_04;
  string original_05;
  string original_06;
  string original_07;
  path leveldb_name;
  __single_object _Var4;
  __single_object *p_Var5;
  bool bVar6;
  CBlockIndex *pCVar7;
  CBlockIndex *pCVar8;
  Chainstate *pCVar9;
  unsigned_long uVar10;
  _Optional_payload_base<int> _Var11;
  CCoinsViewCache *this_01;
  size_t sVar12;
  char *pcVar13;
  ulong uVar14;
  undefined4 uVar15;
  string *psVar16;
  ulong uVar17;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ChainstateManager *pCVar18;
  long in_FS_OFFSET;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var19;
  double dVar20;
  undefined8 uVar21;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  unsigned_long *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  CBlockIndex *pCVar22;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  undefined8 in_stack_fffffffffffffa20;
  allocator<char> local_5a9;
  __single_object snapshot_chainstate;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  string local_578 [32];
  bilingual_str local_558;
  bilingual_str local_518;
  string local_4d8 [32];
  bilingual_str local_4b8;
  bilingual_str local_478;
  string heights_formatted;
  string local_3f8 [32];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  bilingual_str local_398;
  bilingual_str local_358;
  path local_318;
  string local_2f0 [32];
  bilingual_str local_2d0;
  string local_290 [32];
  bilingual_str local_270;
  string local_230 [32];
  bilingual_str local_210;
  string local_1d0 [32];
  bilingual_str local_1b0;
  string local_170 [32];
  bilingual_str local_150;
  string ret;
  undefined1 local_f0;
  __index_type local_d0;
  char local_c0;
  string local_b8 [32];
  bilingual_str local_98;
  uint256 base_blockhash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems;
  base_blockhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 8);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x10);
  uVar21 = *(undefined8 *)
            ((metadata->m_base_blockhash).super_base_blob<256U>.m_data._M_elems + 0x18);
  base_blockhash.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar21;
  SnapshotBlockhash((optional<uint256> *)&ret,this);
  if (local_f0 == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"Can\'t activate a snapshot-based chainstate more than once",
               (allocator<char> *)&ret);
    original._M_string_length = in_stack_fffffffffffffa10;
    original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
    original.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa18;
    original.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
    original.field_2._8_8_ = in_stack_fffffffffffffa20;
    Untranslated(&local_98,original);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
               &local_98);
    bilingual_str::~bilingual_str(&local_98);
    std::__cxx11::string::~string(local_b8);
    goto LAB_008cc734;
  }
  pcVar13 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x162b;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock44,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x162b,false);
  FindFirst<AssumeutxoData,CChainParams::AssumeutxoForBlockhash(uint256_const&)const::_lambda(auto:1_const&)_1_>
            ((optional<AssumeutxoData> *)&ret,&((this->m_options).chainparams)->m_assumeutxo_data,
             &base_blockhash);
  if (local_c0 == '\0') {
    uVar15 = (undefined4)CONCAT71(in_register_00000081,in_memory);
    CChainParams::GetAvailableSnapshotHeights
              ((vector<int,_std::allocator<int>_> *)&cleanup_bad_snapshot,
               (this->m_options).chainparams);
    p_Var5 = cleanup_bad_snapshot.snapshot_chainstate;
    paVar1 = &ret.field_2;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    bVar6 = true;
    ret._M_dataplus._M_p = (pointer)paVar1;
    for (pCVar18 = cleanup_bad_snapshot.this; pCVar18 != (ChainstateManager *)p_Var5;
        pCVar18 = (ChainstateManager *)
                  ((long)&(pCVar18->m_ibd_chainstate)._M_t.
                          super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                          super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                          super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 4)) {
      if (!bVar6) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,", ");
      }
      util::ToString<int>((string *)&criticalblock49,(int *)pCVar18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ret,(string *)&criticalblock49);
      std::__cxx11::string::~string((string *)&criticalblock49);
      bVar6 = false;
    }
    heights_formatted._M_dataplus._M_p = (pointer)&heights_formatted.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ret._M_dataplus._M_p == paVar1) {
      heights_formatted.field_2._8_8_ = ret.field_2._8_8_;
    }
    else {
      heights_formatted._M_dataplus = ret._M_dataplus;
    }
    heights_formatted.field_2._M_allocated_capacity._1_7_ = ret.field_2._M_allocated_capacity._1_7_;
    heights_formatted.field_2._M_local_buf[0] = ret.field_2._M_local_buf[0];
    in_memory = SUB41(uVar15,0);
    heights_formatted._M_string_length = ret._M_string_length;
    ret._M_string_length = 0;
    ret.field_2._M_local_buf[0] = '\0';
    pCVar18 = this;
    ret._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::~string((string *)&ret);
    std::__cxx11::string::string<std::allocator<char>>
              (local_170,
               "assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"
               ,(allocator<char> *)&snapshot_chainstate);
    original_02._M_string_length = (size_type)pCVar18;
    original_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
    original_02.field_2._M_allocated_capacity._0_4_ = uVar15;
    original_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
    original_02.field_2._8_8_ = in_stack_fffffffffffffa20;
    Untranslated((bilingual_str *)&ret,original_02);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&criticalblock49,(base_blob<256u> *)&base_blockhash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_150,(tinyformat *)&ret,(bilingual_str *)&criticalblock49,&heights_formatted,
               args_1);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
               &local_150);
    bilingual_str::~bilingual_str(&local_150);
    std::__cxx11::string::~string((string *)&criticalblock49);
    bilingual_str::~bilingual_str((bilingual_str *)&ret);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string((string *)&heights_formatted);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&cleanup_bad_snapshot);
LAB_008cc094:
    pCVar22 = (CBlockIndex *)0x0;
LAB_008cc11d:
    bVar6 = false;
  }
  else {
    pCVar7 = ::node::BlockManager::LookupBlockIndex(&this->m_blockman,&base_blockhash);
    if (pCVar7 == (CBlockIndex *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_1d0,
                 "The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"
                 ,(allocator<char> *)&heights_formatted);
      original_01._M_string_length = in_stack_fffffffffffffa10;
      original_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
      original_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa18;
      original_01.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
      original_01.field_2._8_8_ = in_stack_fffffffffffffa20;
      Untranslated((bilingual_str *)&ret,original_01);
      base_blob<256u>::ToString_abi_cxx11_
                ((string *)&criticalblock49,(base_blob<256u> *)&base_blockhash);
      tinyformat::format<std::__cxx11::string>
                (&local_1b0,(tinyformat *)&ret,(bilingual_str *)&criticalblock49,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar13);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                 &local_1b0);
      bilingual_str::~bilingual_str(&local_1b0);
      std::__cxx11::string::~string((string *)&criticalblock49);
      bilingual_str::~bilingual_str((bilingual_str *)&ret);
      std::__cxx11::string::~string(local_1d0);
      goto LAB_008cc094;
    }
    if ((pCVar7->nStatus & 0x60) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_230,"The base block header (%s) is part of an invalid chain",
                 (allocator<char> *)&heights_formatted);
      original_00._M_string_length = (size_type)pCVar7;
      original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
      original_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa18;
      original_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
      original_00.field_2._8_8_ = in_stack_fffffffffffffa20;
      Untranslated((bilingual_str *)&ret,original_00);
      base_blob<256u>::ToString_abi_cxx11_
                ((string *)&criticalblock49,(base_blob<256u> *)&base_blockhash);
      tinyformat::format<std::__cxx11::string>
                (&local_210,(tinyformat *)&ret,(bilingual_str *)&criticalblock49,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar13);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                 &local_210);
      bilingual_str::~bilingual_str(&local_210);
      std::__cxx11::string::~string((string *)&criticalblock49);
      bilingual_str::~bilingual_str((bilingual_str *)&ret);
      psVar16 = local_230;
      pCVar22 = pCVar7;
LAB_008cc118:
      std::__cxx11::string::~string(psVar16);
      goto LAB_008cc11d;
    }
    pCVar22 = pCVar7;
    if (this->m_best_header == (CBlockIndex *)0x0) {
LAB_008cc0c2:
      std::__cxx11::string::string<std::allocator<char>>
                (local_290,
                 "A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo."
                 ,(allocator<char> *)&ret);
      original_03._M_string_length = (size_type)pCVar22;
      original_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
      original_03.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa18;
      original_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
      original_03.field_2._8_8_ = in_stack_fffffffffffffa20;
      Untranslated(&local_270,original_03);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                 &local_270);
      bilingual_str::~bilingual_str(&local_270);
      psVar16 = local_290;
      goto LAB_008cc118;
    }
    pCVar8 = CBlockIndex::GetAncestor(this->m_best_header,pCVar7->nHeight);
    if (pCVar8 != pCVar7) goto LAB_008cc0c2;
    this_00 = this->m_active_chainstate->m_mempool;
    bVar6 = true;
    if (this_00 != (CTxMemPool *)0x0) {
      uVar10 = CTxMemPool::size(this_00);
      if (uVar10 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_2f0,"Can\'t activate a snapshot when mempool not empty",
                   (allocator<char> *)&ret);
        original_07._M_string_length = (size_type)pCVar22;
        original_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
        original_07.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffa18;
        original_07.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffa1c;
        original_07.field_2._8_8_ = in_stack_fffffffffffffa20;
        Untranslated(&local_2d0,original_07);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                   &local_2d0);
        bilingual_str::~bilingual_str(&local_2d0);
        psVar16 = local_2f0;
        goto LAB_008cc118;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock44.super_unique_lock);
  if (!bVar6) goto LAB_008cc734;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&ret,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x1657,false);
  pCVar9 = ActiveChainstate(this);
  sVar12 = pCVar9->m_coinsdb_cache_size_bytes;
  pCVar9 = ActiveChainstate(this);
  sVar3 = pCVar9->m_coinstip_cache_size_bytes;
  pCVar9 = ActiveChainstate(this);
  _Var19._M_head_impl = (_Impl *)(double)(long)sVar3;
  uVar14 = (ulong)((double)_Var19._M_head_impl * 0.01);
  dVar20 = (double)(long)sVar12;
  uVar17 = (ulong)(dVar20 * 0.01);
  Chainstate::ResizeCoinsCaches
            (pCVar9,(long)((double)_Var19._M_head_impl * 0.01 - 9.223372036854776e+18) &
                    (long)uVar14 >> 0x3f | uVar14,
             (long)(dVar20 * 0.01 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&ret);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&ret,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x166c,false);
  criticalblock49.super_unique_lock._M_device = (mutex_type *)0x0;
  std::make_unique<Chainstate,decltype(nullptr),node::BlockManager&,ChainstateManager&,uint256&>
            ((void **)&snapshot_chainstate,(BlockManager *)&criticalblock49,
             (ChainstateManager *)&this->m_blockman,(uint256 *)this);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&ret);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&ret,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x166f,false);
  _Var4 = snapshot_chainstate;
  fs::path::path((path *)&local_318,"chainstate");
  uVar14 = (ulong)(dVar20 * 0.99);
  leveldb_name.super_path._M_pathname._M_string_length = (size_type)pCVar22;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity._0_4_ = SUB84(dVar20,0);
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity._4_4_ =
       (int)((ulong)dVar20 >> 0x20);
  leveldb_name.super_path._M_pathname.field_2._8_1_ = (uchar)uVar21;
  leveldb_name.super_path._M_pathname.field_2._9_1_ = SUB81(uVar21,1);
  leveldb_name.super_path._M_pathname.field_2._10_1_ = SUB81(uVar21,2);
  leveldb_name.super_path._M_pathname.field_2._11_1_ = SUB81(uVar21,3);
  leveldb_name.super_path._M_pathname.field_2._12_1_ = SUB81(uVar21,4);
  leveldb_name.super_path._M_pathname.field_2._13_1_ = SUB81(uVar21,5);
  leveldb_name.super_path._M_pathname.field_2._14_1_ = SUB81(uVar21,6);
  leveldb_name.super_path._M_pathname.field_2._15_1_ = SUB81(uVar21,7);
  leveldb_name.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )_Var19._M_head_impl;
  Chainstate::InitCoinsDB
            ((Chainstate *)
             _Var4._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
             (long)(dVar20 * 0.99 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14,in_memory
             ,false,leveldb_name);
  std::filesystem::__cxx11::path::~path(&local_318);
  uVar14 = (ulong)((double)_Var19._M_head_impl * 0.99);
  Chainstate::InitCoinsCache
            ((Chainstate *)
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
             (long)((double)_Var19._M_head_impl * 0.99 - 9.223372036854776e+18) &
             (long)uVar14 >> 0x3f | uVar14);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&ret);
  cleanup_bad_snapshot.this = this;
  cleanup_bad_snapshot.snapshot_chainstate = &snapshot_chainstate;
  PopulateAndValidateSnapshot
            ((Result<void> *)&ret,this,
             (Chainstate *)
             snapshot_chainstate._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,coins_file,metadata);
  if (local_d0 == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&ret);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock49,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
               ,0x168f,false);
    pCVar7 = ActiveTip(this);
    if (*(long *)((long)snapshot_chainstate._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x60) ==
        *(long *)((long)snapshot_chainstate._M_t.
                        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x58)) {
      pCVar8 = (CBlockIndex *)0x0;
    }
    else {
      pCVar8 = *(CBlockIndex **)
                (*(long *)((long)snapshot_chainstate._M_t.
                                 super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>
                                 .super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl + 0x60) +
                -8);
    }
    bVar6 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)&ret,pCVar7,pCVar8);
    if (bVar6) {
      if (in_memory == false) {
        pCVar7 = pCVar22;
        bVar6 = ::node::WriteSnapshotBaseBlockhash
                          ((Chainstate *)
                           snapshot_chainstate._M_t.
                           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
        if (!bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_578,"could not write base blockhash",(allocator<char> *)&ret);
          original_06._M_string_length = (size_type)pCVar7;
          original_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
          original_06.field_2._M_allocated_capacity._0_4_ = SUB84(dVar20,0);
          original_06.field_2._M_allocated_capacity._4_4_ = (int)((ulong)dVar20 >> 0x20);
          original_06.field_2._8_1_ = (uchar)uVar21;
          original_06.field_2._9_1_ = SUB81(uVar21,1);
          original_06.field_2._10_1_ = SUB81(uVar21,2);
          original_06.field_2._11_1_ = SUB81(uVar21,3);
          original_06.field_2._12_1_ = SUB81(uVar21,4);
          original_06.field_2._13_1_ = SUB81(uVar21,5);
          original_06.field_2._14_1_ = SUB81(uVar21,6);
          original_06.field_2._15_1_ = SUB81(uVar21,7);
          Untranslated(&local_558,original_06);
          ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                    ((Error *)&local_518,&cleanup_bad_snapshot,&local_558);
          std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
          _Variant_storage<0ul,bilingual_str>
                    ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                     &local_518);
          bilingual_str::~bilingual_str(&local_518);
          bilingual_str::~bilingual_str(&local_558);
          psVar16 = local_578;
          goto LAB_008cc718;
        }
      }
      _Var4._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           snapshot_chainstate._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      if ((this->m_snapshot_chainstate)._M_t.
          super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
          super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
          super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
        __assert_fail("!m_snapshot_chainstate",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x169f,
                      "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                     );
      }
      (this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           (Chainstate *)
           snapshot_chainstate._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      snapshot_chainstate._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
      _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl =
           (__uniq_ptr_data<Chainstate,_std::default_delete<Chainstate>,_true,_true>)
           (__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>)0x0;
      bVar6 = Chainstate::LoadChainTip
                        ((Chainstate *)
                         _Var4._M_t.
                         super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                         super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                         super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
      if (!bVar6) {
        __assert_fail("chaintip_loaded",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x16a2,
                      "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                     );
      }
      uVar10 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
      ret._M_dataplus._M_p._0_1_ = uVar10 == 0;
      inline_assertion_check<true,bool>
                ((bool *)&ret,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0x16a6,"ActivateSnapshot","m_active_chainstate->m_mempool->size() == 0");
      ret._M_dataplus._M_p._0_1_ =
           ((this->m_snapshot_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool == (CTxMemPool *)0x0
      ;
      inline_assertion_check<true,bool>
                ((bool *)&ret,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                 ,0x16a7,"ActivateSnapshot","!m_snapshot_chainstate->m_mempool");
      pCVar9 = this->m_active_chainstate;
      ((this->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool = pCVar9->m_mempool;
      pCVar9->m_mempool = (CTxMemPool *)0x0;
      this->m_active_chainstate =
           (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
      _Var11 = (_Optional_payload_base<int>)GetSnapshotBaseHeight(this);
      (this->m_blockman).m_snapshot_height.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = _Var11;
      base_blob<256u>::ToString_abi_cxx11_(&ret,(base_blob<256u> *)&base_blockhash);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "ActivateSnapshot";
      logging_function._M_len = 0x10;
      ::LogPrintf_<std::__cxx11::string>
                (logging_function,source_file,0x16ad,ALL,Info,
                 "[snapshot] successfully activated snapshot %s\n",&ret);
      std::__cxx11::string::~string((string *)&ret);
      this_01 = Chainstate::CoinsTip
                          ((this->m_snapshot_chainstate)._M_t.
                           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
      pcVar13 = (char *)0x8cc647;
      sVar12 = CCoinsViewCache::DynamicMemoryUsage(this_01);
      ret._M_dataplus._M_p = (pointer)(sVar12 / 1000000);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x57;
      logging_function_00._M_str = "ActivateSnapshot";
      logging_function_00._M_len = 0x10;
      LogPrintf_<unsigned_long>
                (logging_function_00,source_file_00,0x16af,
                 IPC|I2P|QT|COINDB|LIBEVENT|PROXY|REINDEX|SELECTCOINS|ESTIMATEFEE|MEMPOOL|NET,
                 (Level)&ret,pcVar13,in_stack_fffffffffffffa08);
      MaybeRebalanceCaches(this);
      *(CBlockIndex **)__return_storage_ptr__ = pCVar22;
      *(_Variant_storage<false,bilingual_str,CBlockIndex*> *)((long)__return_storage_ptr__ + 0x40) =
           (_Variant_storage<false,bilingual_str,CBlockIndex*>)0x1;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_4d8,"work does not exceed active chainstate",(allocator<char> *)&ret);
      original_05._M_string_length = (size_type)pCVar22;
      original_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
      original_05.field_2._M_allocated_capacity._0_4_ = SUB84(dVar20,0);
      original_05.field_2._M_allocated_capacity._4_4_ = (int)((ulong)dVar20 >> 0x20);
      original_05.field_2._8_1_ = (uchar)uVar21;
      original_05.field_2._9_1_ = SUB81(uVar21,1);
      original_05.field_2._10_1_ = SUB81(uVar21,2);
      original_05.field_2._11_1_ = SUB81(uVar21,3);
      original_05.field_2._12_1_ = SUB81(uVar21,4);
      original_05.field_2._13_1_ = SUB81(uVar21,5);
      original_05.field_2._14_1_ = SUB81(uVar21,6);
      original_05.field_2._15_1_ = SUB81(uVar21,7);
      Untranslated(&local_4b8,original_05);
      ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                ((Error *)&local_478,&cleanup_bad_snapshot,&local_4b8);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
                 &local_478);
      bilingual_str::~bilingual_str(&local_478);
      bilingual_str::~bilingual_str(&local_4b8);
      psVar16 = local_4d8;
LAB_008cc718:
      std::__cxx11::string::~string(psVar16);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
  }
  else {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock44,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
               ,0x168b,false);
    std::__cxx11::string::string<std::allocator<char>>(local_3f8,"Population failed: %s",&local_5a9)
    ;
    original_04._M_string_length = (size_type)pCVar22;
    original_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa08;
    original_04.field_2._M_allocated_capacity._0_4_ = SUB84(dVar20,0);
    original_04.field_2._M_allocated_capacity._4_4_ = (int)((ulong)dVar20 >> 0x20);
    original_04.field_2._8_1_ = (uchar)uVar21;
    original_04.field_2._9_1_ = SUB81(uVar21,1);
    original_04.field_2._10_1_ = SUB81(uVar21,2);
    original_04.field_2._11_1_ = SUB81(uVar21,3);
    original_04.field_2._12_1_ = SUB81(uVar21,4);
    original_04.field_2._13_1_ = SUB81(uVar21,5);
    original_04.field_2._14_1_ = SUB81(uVar21,6);
    original_04.field_2._15_1_ = SUB81(uVar21,7);
    Untranslated((bilingual_str *)&criticalblock49,original_04);
    util::ErrorString<void>((bilingual_str *)&heights_formatted,(Result<void> *)&ret);
    tinyformat::format<bilingual_str>
              (&local_398,(bilingual_str *)&criticalblock49,(bilingual_str *)&heights_formatted);
    ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
              ((Error *)&local_358,&cleanup_bad_snapshot,&local_398);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,CBlockIndex*>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__,
               &local_358);
    bilingual_str::~bilingual_str(&local_358);
    bilingual_str::~bilingual_str(&local_398);
    bilingual_str::~bilingual_str((bilingual_str *)&heights_formatted);
    bilingual_str::~bilingual_str((bilingual_str *)&criticalblock49);
    std::__cxx11::string::~string(local_3f8);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock44.super_unique_lock);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&ret);
  }
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr(&snapshot_chainstate);
LAB_008cc734:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (Result<CBlockIndex_*> *)
           (_Variant_storage<false,bilingual_str,CBlockIndex*> *)__return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }